

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O3

void RK_Individual::criaCromossomos(Graph *g)

{
  Chromosome *in_RAX;
  int iVar1;
  Edge *pEVar2;
  Vertex *pVVar3;
  Chromosome *c;
  Chromosome *local_38;
  
  pVVar3 = g->verticesList;
  if (pVVar3 != (Vertex *)0x0) {
    iVar1 = 0;
    local_38 = in_RAX;
    do {
      for (pEVar2 = pVVar3->edgesList; pEVar2 != (Edge *)0x0; pEVar2 = pEVar2->nextEdge) {
        if ((pEVar2->modifiable == true) && (pEVar2->marked == true)) {
          local_38 = (Chromosome *)operator_new(0x18);
          *(undefined8 *)&local_38->position = 0;
          local_38->edge = pEVar2;
          local_38->weight = 0.0;
          local_38->position = iVar1;
          if (cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Chromosome*,std::allocator<Chromosome*>>::
            _M_realloc_insert<Chromosome*const&>
                      ((vector<Chromosome*,std::allocator<Chromosome*>> *)&cromossomos,
                       (iterator)
                       cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_38);
          }
          else {
            *cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_38;
            cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          iVar1 = iVar1 + 1;
        }
      }
      pVVar3 = pVVar3->nextVertex;
    } while (pVVar3 != (Vertex *)0x0);
  }
  return;
}

Assistant:

void RK_Individual::criaCromossomos(Graph *g){
    Chromosome *c;
    int i = 0;
    for(Vertex *v = g->get_verticesList(); v != NULL; v= v->getNext()){

        for(Edge *e = v->getEdgesList(); e != NULL; e= e->getNext()){

            /**individuo possui somente arcos modificaveis e em um sentido
            (antes tinhamos arcos a-b e b-a, agora usamos somente um deles)**/
            if(e->getModifiable() == true && e->getMarked() == true){
                c = new Chromosome();
                c->edge = e;
                c->weight = 0;
                c->position = i;
                cromossomos.push_back(c);
                i++;
            }
        }

    }
}